

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O1

void __thiscall
tchecker::
join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
::advance_while_empty_range
          (join_iterator_t<tchecker::range_t<boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>,_boost::iterators::transform_iterator<std::function<tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_(unsigned_int)>,_const_unsigned_int_*,_boost::use_default,_boost::use_default>_>,_tchecker::range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>_>
           *this)

{
  uint *puVar1;
  range_t<tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t,_tchecker::syncprod::system_t::asynchronous_edges_const_iterator_t>
  rVar2;
  
  if ((this->_it).super_type.m_iterator != (this->_end).super_type.m_iterator) {
    do {
      if ((this->_get_sub_range).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      rVar2 = (*(this->_get_sub_range)._M_invoker)((_Any_data *)&this->_get_sub_range,&this->_it);
      this->_range_it = (begin_iterator_t)rVar2._begin.super_const_iterator._M_current;
      this->_range_end = (end_iterator_t)rVar2._end.super_const_iterator._M_current;
    } while ((rVar2._begin.super_const_iterator._M_current.super_const_iterator ==
              (shared_ptr<const_tchecker::system::edge_t> *)
              rVar2._end.super_const_iterator._M_current) &&
            (puVar1 = (this->_it).super_type.m_iterator + 1,
            (this->_it).super_type.m_iterator = puVar1, puVar1 != (this->_end).super_type.m_iterator
            ));
  }
  if ((this->_it).super_type.m_iterator == (this->_end).super_type.m_iterator) {
    (this->_range_it).super_const_iterator._M_current =
         (shared_ptr<const_tchecker::system::edge_t> *)0x0;
    (this->_range_end).super_const_iterator._M_current =
         (shared_ptr<const_tchecker::system::edge_t> *)0x0;
  }
  return;
}

Assistant:

void advance_while_empty_range()
  {
    // Find first non-empty range, if any
    while (_it != _end) {
      std::tie(_range_it, _range_end) = _get_sub_range(_it).iterators();
      if (_range_it != _range_end)
        break;
      ++_it;
    }
    if (_it == _end) {
      _range_it = typename SUBR::begin_iterator_t{};
      _range_end = typename SUBR::end_iterator_t{};
    }
  }